

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

Item * __thiscall World::add_gold_item(World *this,uint8_t worth)

{
  uint16_t uVar1;
  size_type sVar2;
  mapped_type *ppIVar3;
  Item *item;
  byte local_1b;
  uint8_t local_1a;
  byte local_19;
  uint8_t i;
  uint8_t first_available_id;
  World *pWStack_18;
  uint8_t worth_local;
  World *this_local;
  
  local_1a = '@';
  local_1b = 0x40;
  local_19 = worth;
  pWStack_18 = this;
  while ((local_1b < 0x70 &&
         (sVar2 = std::
                  map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                  ::count(&this->_items,&local_1b), sVar2 != 0))) {
    local_1a = local_1b + 1;
    ppIVar3 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::operator[](&this->_items,&local_1b);
    uVar1 = Item::gold_value(*ppIVar3);
    if (uVar1 == local_19) {
      ppIVar3 = std::
                map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                ::operator[](&this->_items,&local_1b);
      return *ppIVar3;
    }
    local_1b = local_1b + 1;
  }
  if (local_1a == 'p') {
    this_local = (World *)0x0;
  }
  else {
    item = (Item *)operator_new(0x40);
    ItemGolds::ItemGolds((ItemGolds *)item,local_1a,(ushort)local_19);
    this_local = (World *)add_item(this,item);
  }
  return (Item *)this_local;
}

Assistant:

Item* World::add_gold_item(uint8_t worth)
{
    uint8_t first_available_id = ITEM_GOLDS_START;

    // Try to find an item with the same worth
    for(uint8_t i=ITEM_GOLDS_START ; i<ITEM_GOLDS_END ; ++i)
    {
        if(_items.count(i) == 0)
            break;

        first_available_id = i+1;
        if(_items[i]->gold_value() == worth)
            return _items[i];
    }

    // If we consumed all item IDs, don't add it you fool!
    if(first_available_id == ITEM_GOLDS_END)
        return nullptr;

    return this->add_item(new ItemGolds(first_available_id, worth));
}